

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O1

void __thiscall Imf_2_5::StdOFStream::StdOFStream(StdOFStream *this,char *fileName)

{
  ofstream *this_00;
  
  OStream::OStream(&this->super_OStream,fileName);
  (this->super_OStream)._vptr_OStream = (_func_int **)&PTR__StdOFStream_00380620;
  this_00 = (ofstream *)operator_new(0x200);
  std::ofstream::ofstream(this_00,fileName,_S_bin);
  this->_os = (ofstream *)this_00;
  this->_deleteStream = true;
  if (((byte)this_00[*(long *)(*(long *)this_00 + -0x18) + 0x20] & 5) != 0) {
    (**(code **)(*(long *)this_00 + 8))(this_00);
    Iex_2_5::throwErrnoExc();
  }
  return;
}

Assistant:

StdOFStream::StdOFStream (const char fileName[])
    : OPENEXR_IMF_INTERNAL_NAMESPACE::OStream (fileName)
    , _os (make_ofstream (fileName))
    , _deleteStream (true)
{
    if (!*_os)
    {
	delete _os;
	IEX_NAMESPACE::throwErrnoExc();
    }
}